

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

int mk_sched_event_read(mk_sched_conn *conn,mk_sched_worker *sched,mk_server *server)

{
  int *piVar1;
  int ret;
  mk_server *server_local;
  mk_sched_worker *sched_local;
  mk_sched_conn *conn_local;
  
  conn_local._4_4_ = (*conn->protocol->cb_read)(conn,sched,server);
  if (conn_local._4_4_ == -1) {
    piVar1 = __errno_location();
    if (*piVar1 == 0xb) {
      conn_local._4_4_ = 1;
    }
    else {
      conn_local._4_4_ = -1;
    }
  }
  return conn_local._4_4_;
}

Assistant:

int mk_sched_event_read(struct mk_sched_conn *conn,
                        struct mk_sched_worker *sched,
                        struct mk_server *server)
{
    int ret = 0;

#ifdef MK_HAVE_TRACE
    MK_TRACE("[FD %i] Connection Handler / read", conn->event.fd);
#endif

    /*
     * When the event loop notify that there is some readable information
     * from the socket, we need to invoke the protocol handler associated
     * to this connection and also pass as a reference the 'read()' function
     * that handle 'read I/O' operations, e.g:
     *
     *  - plain sockets through liana will use just read(2)
     *  - ssl though mbedtls should use mk_mbedtls_read(..)
     */
    ret = conn->protocol->cb_read(conn, sched, server);
    if (ret == -1) {
        if (errno == EAGAIN) {
            MK_TRACE("[FD %i] EAGAIN: need to read more data", conn->event.fd);
            return 1;
        }
        return -1;
    }

    return ret;
}